

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O1

string * __thiscall
phpconvert::ZendParser::generateAlias
          (string *__return_storage_ptr__,ZendParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *type,uint parts)

{
  pointer pbVar1;
  pointer pcVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  pbVar1 = (type->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(type->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if (uVar3 == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar1->_M_string_length);
  }
  else if (uVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar4 = 0;
    if (parts < uVar3) {
      uVar4 = (int)uVar3 - parts;
    }
    uVar5 = (ulong)uVar4;
    if (parts == 0) {
      uVar5 = 0;
    }
    for (; (uint)uVar5 <= (int)uVar3 - 1U; uVar5 = (ulong)((uint)uVar5 + 1)) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,
                 (ulong)(type->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ZendParser::generateAlias(vector<string> &type, unsigned int parts) {
        if (type.size() <= 0)
            return "";
        if (type.size() == 1)
            return type[0];

        unsigned int limit = type.size() - 1;
        unsigned int start = limit - (parts - 1);
        string alias;

        if (parts <= 0 || parts >= type.size())
            start = 0;

        while (start <= limit) {
            alias += type[start];
            start++;
        }
        return alias;
    }